

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void yyStackOverflow(yyParser *yypParser)

{
  Parse *pParse;
  yyStackEntry *pyVar1;
  
  pParse = yypParser->pParse;
  pyVar1 = yypParser->yytos;
  while (yypParser->yystack < pyVar1) {
    yypParser->yytos = pyVar1 + -1;
    yy_destructor(yypParser,pyVar1->major,&pyVar1->minor);
    pyVar1 = yypParser->yytos;
  }
  sqlite3ErrorMsg(pParse,"parser stack overflow");
  yypParser->pParse = pParse;
  return;
}

Assistant:

static void yyStackOverflow(yyParser *yypParser){
   sqlite3ParserARG_FETCH
   sqlite3ParserCTX_FETCH
#ifndef NDEBUG
   if( yyTraceFILE ){
     fprintf(yyTraceFILE,"%sStack Overflow!\n",yyTracePrompt);
   }
#endif
   while( yypParser->yytos>yypParser->yystack ) yy_pop_parser_stack(yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */
/******** Begin %stack_overflow code ******************************************/

  sqlite3ErrorMsg(pParse, "parser stack overflow");
/******** End %stack_overflow code ********************************************/
   sqlite3ParserARG_STORE /* Suppress warning about unused %extra_argument var */
   sqlite3ParserCTX_STORE
}